

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int windowExprGtZero(Parse *pParse,Expr *pExpr)

{
  sqlite3_value *psVar1;
  i64 iVar2;
  sqlite3_value *v;
  uint uVar3;
  sqlite3_value *pVal;
  sqlite3_value *local_20;
  
  local_20 = (Mem *)0x0;
  if (pExpr == (Expr *)0x0) {
    v = (sqlite3_value *)0x0;
    uVar3 = 0;
  }
  else {
    valueFromExpr((sqlite3 *)pParse,pExpr,*(u8 *)((long)&pParse->pConstExpr + 6),'C',&local_20,
                  (ValueNewStat4Ctx *)0x0);
    psVar1 = local_20;
    uVar3 = 0;
    v = (sqlite3_value *)0x0;
    if (local_20 != (Mem *)0x0) {
      iVar2 = sqlite3VdbeIntValue(local_20);
      uVar3 = (uint)(0 < (int)iVar2);
      v = psVar1;
    }
  }
  sqlite3ValueFree(v);
  return uVar3;
}

Assistant:

static int windowExprGtZero(Parse *pParse, Expr *pExpr){
  int ret = 0;
  sqlite3 *db = pParse->db;
  sqlite3_value *pVal = 0;
  sqlite3ValueFromExpr(db, pExpr, db->enc, SQLITE_AFF_NUMERIC, &pVal);
  if( pVal && sqlite3_value_int(pVal)>0 ){
    ret = 1;
  }
  sqlite3ValueFree(pVal);
  return ret;
}